

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::filter_expression::evaluate
          (filter_expression *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  bool bVar1;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *peVar2;
  json_array_arg_t *in_RDI;
  reference jj;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> j;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  new_context;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *item;
  iterator __end0;
  iterator __begin0;
  const_array_range_type *__range4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *result;
  error_code *in_stack_00000330;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_00000338;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *in_stack_00000340;
  reference in_stack_00000348;
  vector<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffef8;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff18;
  error_code *ec_00;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff30;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  **in_stack_ffffffffffffff48;
  json_const_pointer_arg_t *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  error_code local_98 [3];
  reference local_60;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_58;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  local_50;
  const_array_range_type local_48;
  range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  *local_38;
  reference local_30;
  reference local_8;
  
  bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    (in_stack_ffffffffffffff18);
  if (bVar1) {
    local_30 = eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
               ::create_json<jsoncons::json_array_arg_t_const&>(in_stack_ffffffffffffff30,in_RDI);
    local_48 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
               array_range((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)in_stack_ffffffffffffff50);
    local_38 = &local_48;
    local_50._M_current =
         (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
         range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
         ::begin(local_38);
    local_58 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
               ::end(local_38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffff00,
                              (__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffef8), bVar1) {
      local_60 = __gnu_cxx::
                 __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_50);
      ec_00 = local_98;
      eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::eval_context(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>_>
                      *)0x5074e3);
      peVar2 = (eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)evaluate_tokens(in_stack_00000348,in_stack_00000340,in_stack_00000338,
                                  in_stack_00000330);
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 &stack0xffffffffffffff58,peVar2);
      bVar1 = is_true((reference)0x50752b);
      if (bVar1) {
        peVar2 = (eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)projection_base::apply_expressions
                              ((projection_base *)in_stack_ffffffffffffff30,(reference)in_RDI,peVar2
                               ,ec_00);
        in_stack_ffffffffffffff00 = peVar2;
        bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_null
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)ec_00);
        if (!bVar1) {
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const*>
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          in_stack_ffffffffffffff30 = peVar2;
        }
      }
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 0x5075dc);
      eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::~eval_context((eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)0x5075e6);
      __gnu_cxx::
      __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      ::operator++(&local_50);
    }
    local_8 = local_30;
  }
  else {
    local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              ::null_value((eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  }
  return local_8;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_array())
                {
                    return context.null_value();
                }
                auto result = context.create_json(json_array_arg);

                for (auto& item : val.array_range())
                {
                    eval_context<Json> new_context{ context.temp_storage_, context.variables_ };
                    Json j(json_const_pointer_arg, evaluate_tokens(item, token_list_, new_context, ec));
                    if (is_true(j))
                    {
                        reference jj = this->apply_expressions(item, context, ec);
                        if (!jj.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(jj));
                        }
                    }
                }
                return *result;
            }